

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_metrics.c
# Opt level: O3

void ares_metrics_record(ares_query_t *query,ares_server_t *server,ares_status_t status,
                        ares_dns_record_t *dnsrec)

{
  ares_dns_rcode_t aVar1;
  ares_server_metrics_t *paVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  ares_timeval_t now;
  ares_timeval_t tvdiff;
  ares_timeval_t local_40;
  ares_timeval_t local_30;
  
  if (server != (ares_server_t *)0x0 && status == ARES_SUCCESS) {
    ares_tvnow(&local_40);
    aVar1 = ares_dns_record_get_rcode(dnsrec);
    if ((aVar1 == ARES_RCODE_NXDOMAIN) || (aVar1 == ARES_RCODE_NOERROR)) {
      ares_timeval_diff(&local_30,&query->ts,&local_40);
      iVar3 = (int)local_30.sec * 1000 + local_30.usec / 1000;
      uVar4 = iVar3 + (uint)(iVar3 == 0);
      paVar2 = server->metrics;
      lVar5 = 0;
      do {
        if (local_40.sec / 0x3c == paVar2->ts) {
          if (uVar4 <= paVar2->latency_min_ms - 1) goto LAB_0011273a;
        }
        else {
          paVar2->prev_ts = paVar2->ts;
          paVar2->prev_total_ms = paVar2->total_ms;
          paVar2->prev_total_count = paVar2->total_count;
          paVar2->ts = local_40.sec / 0x3c;
          paVar2->latency_min_ms = 0;
          paVar2->latency_max_ms = 0;
          paVar2->total_ms = 0;
          paVar2->total_count = 0;
LAB_0011273a:
          paVar2->latency_min_ms = uVar4;
        }
        if (paVar2->latency_max_ms < uVar4) {
          paVar2->latency_max_ms = uVar4;
        }
        paVar2->total_ms = paVar2->total_ms + (ulong)uVar4;
        paVar2->total_count = paVar2->total_count + 1;
        lVar5 = lVar5 + 1;
        paVar2 = paVar2 + 1;
      } while (lVar5 != 5);
    }
  }
  return;
}

Assistant:

void ares_metrics_record(const ares_query_t *query, ares_server_t *server,
                         ares_status_t status, const ares_dns_record_t *dnsrec)
{
  ares_timeval_t       now;
  ares_timeval_t       tvdiff;
  unsigned int         query_ms;
  ares_dns_rcode_t     rcode;
  ares_server_bucket_t i;

  if (status != ARES_SUCCESS) {
    return;
  }

  if (server == NULL) {
    return;
  }

  ares_tvnow(&now);

  rcode = ares_dns_record_get_rcode(dnsrec);
  if (rcode != ARES_RCODE_NOERROR && rcode != ARES_RCODE_NXDOMAIN) {
    return;
  }

  ares_timeval_diff(&tvdiff, &query->ts, &now);
  query_ms = (unsigned int)((tvdiff.sec * 1000) + (tvdiff.usec / 1000));
  if (query_ms == 0) {
    query_ms = 1;
  }

  /* Place in each bucket */
  for (i = 0; i < ARES_METRIC_COUNT; i++) {
    time_t ts = ares_metric_timestamp(i, &now, ARES_FALSE);

    /* Copy metrics to prev and clear */
    if (ts != server->metrics[i].ts) {
      server->metrics[i].prev_ts          = server->metrics[i].ts;
      server->metrics[i].prev_total_ms    = server->metrics[i].total_ms;
      server->metrics[i].prev_total_count = server->metrics[i].total_count;
      server->metrics[i].ts               = ts;
      server->metrics[i].latency_min_ms   = 0;
      server->metrics[i].latency_max_ms   = 0;
      server->metrics[i].total_ms         = 0;
      server->metrics[i].total_count      = 0;
    }

    if (server->metrics[i].latency_min_ms == 0 ||
        server->metrics[i].latency_min_ms > query_ms) {
      server->metrics[i].latency_min_ms = query_ms;
    }

    if (query_ms > server->metrics[i].latency_max_ms) {
      server->metrics[i].latency_max_ms = query_ms;
    }

    server->metrics[i].total_count++;
    server->metrics[i].total_ms += (ares_uint64_t)query_ms;
  }
}